

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceCodeInfo_Location::SharedDtor(SourceCodeInfo_Location *this)

{
  string *psVar1;
  SourceCodeInfo_Location *this_local;
  
  if ((this->leading_comments_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->leading_comments_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->trailing_comments_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->trailing_comments_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::SharedDtor() {
  if (leading_comments_ != &::google::protobuf::internal::kEmptyString) {
    delete leading_comments_;
  }
  if (trailing_comments_ != &::google::protobuf::internal::kEmptyString) {
    delete trailing_comments_;
  }
  if (this != default_instance_) {
  }
}